

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O1

void __thiscall
basisu::vector<basisu::tree_vector_quant<basisu::vec<6U,_float>_>::tsvq_node>::erase
          (vector<basisu::tree_vector_quant<basisu::vec<6U,_float>_>::tsvq_node> *this,
          uint32_t start,uint32_t n)

{
  vector<unsigned_int> *this_00;
  int *piVar1;
  tsvq_node *ptVar2;
  uint *__src;
  void *__ptr;
  uint64_t uVar3;
  undefined4 uVar4;
  int32_t iVar5;
  uint uVar6;
  long lVar7;
  vec<6U,_float> *pvVar8;
  ulong uVar9;
  vec<6U,_float> *pvVar10;
  tsvq_node *ptVar11;
  tsvq_node *ptVar12;
  tsvq_node *ptVar13;
  
  if (n + start <= this->m_size) {
    if (n != 0) {
      ptVar2 = this->m_p;
      uVar9 = (ulong)n;
      uVar6 = this->m_size - (n + start);
      if (uVar6 != 0) {
        ptVar12 = ptVar2 + start;
        ptVar13 = ptVar12 + uVar6;
        ptVar11 = ptVar12 + uVar9;
        pvVar10 = &ptVar2[start].m_origin;
        do {
          uVar4 = *(undefined4 *)&ptVar11->field_0x4;
          uVar3 = ptVar11->m_weight;
          ptVar12->m_var = ptVar11->m_var;
          *(undefined4 *)&ptVar12->field_0x4 = uVar4;
          ptVar12->m_weight = uVar3;
          if (ptVar12 != ptVar11) {
            lVar7 = 6;
            pvVar8 = pvVar10;
            do {
              pvVar8->m_v[0] = pvVar8[uVar9 * 3].m_v[0];
              pvVar8 = (vec<6U,_float> *)(pvVar8->m_v + 1);
              lVar7 = lVar7 + -1;
            } while (lVar7 != 0);
          }
          iVar5 = ptVar11->m_right_index;
          ptVar12->m_left_index = ptVar11->m_left_index;
          ptVar12->m_right_index = iVar5;
          if (ptVar12 != ptVar11) {
            this_00 = &ptVar12->m_training_vecs;
            if ((ptVar12->m_training_vecs).m_capacity < (ptVar11->m_training_vecs).m_size) {
              if (this_00->m_p != (uint *)0x0) {
                free(this_00->m_p);
                this_00->m_p = (uint *)0x0;
                (ptVar12->m_training_vecs).m_size = 0;
                (ptVar12->m_training_vecs).m_capacity = 0;
              }
              elemental_vector::increase_capacity
                        ((elemental_vector *)this_00,(ptVar11->m_training_vecs).m_size,false,4,
                         (object_mover)0x0,false);
            }
            else if ((ptVar12->m_training_vecs).m_size != 0) {
              (ptVar12->m_training_vecs).m_size = 0;
            }
            if ((this_00->m_p != (uint *)0x0) &&
               (__src = (ptVar11->m_training_vecs).m_p, __src != (uint *)0x0)) {
              memcpy(this_00->m_p,__src,(ulong)(ptVar11->m_training_vecs).m_size << 2);
            }
            (ptVar12->m_training_vecs).m_size = (ptVar11->m_training_vecs).m_size;
          }
          piVar1 = &ptVar11->m_codebook_index;
          ptVar11 = ptVar11 + 1;
          ptVar12->m_codebook_index = *piVar1;
          ptVar12 = ptVar12 + 1;
          pvVar10 = pvVar10 + 3;
        } while (ptVar12 != ptVar13);
      }
      lVar7 = 0;
      do {
        __ptr = *(void **)((long)(&ptVar2[(ulong)start + (ulong)uVar6].m_origin + 1) + lVar7 + 8);
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        lVar7 = lVar7 + 0x48;
      } while (uVar9 * 0x48 != lVar7);
      this->m_size = this->m_size - n;
    }
    return;
  }
  __assert_fail("(start + n) <= m_size",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x2e3,
                "void basisu::vector<basisu::tree_vector_quant<basisu::vec<6, float>>::tsvq_node>::erase(uint32_t, uint32_t) [T = basisu::tree_vector_quant<basisu::vec<6, float>>::tsvq_node]"
               );
}

Assistant:

inline void erase(uint32_t start, uint32_t n)
      {
         assert((start + n) <= m_size);
         if ((start + n) > m_size)
            return;

         if (!n)
            return;

         const uint32_t num_to_move = m_size - (start + n);

         T* pDst = m_p + start;

         const T* pSrc = m_p + start + n;

         if (BASISU_IS_BITWISE_COPYABLE_OR_MOVABLE(T))
         {
            // This test is overly cautious.
            if ((!BASISU_IS_BITWISE_COPYABLE(T)) || (BASISU_HAS_DESTRUCTOR(T)))
            {
               // Type has been marked explictly as bitwise movable, which means we can move them around but they may need to be destructed.
               // First destroy the erased objects.
               scalar_type<T>::destruct_array(pDst, n);
            }

            // Copy "down" the objects to preserve, filling in the empty slots.
            memmove(pDst, pSrc, num_to_move * sizeof(T));
         }
         else
         {
            // Type is not bitwise copyable or movable. 
            // Move them down one at a time by using the equals operator, and destroying anything that's left over at the end.
            T* pDst_end = pDst + num_to_move;
            while (pDst != pDst_end)
               *pDst++ = *pSrc++;

            scalar_type<T>::destruct_array(pDst_end, n);
         }

         m_size -= n;
      }